

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int isDupColumn(Index *pIdx,int nKey,Index *pPk,int iCol)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  
  if (nKey < 1) {
    return 0;
  }
  uVar3 = 0;
LAB_0018c938:
  if (pIdx->aiColumn[uVar3] == pPk->aiColumn[iCol]) {
    lVar4 = 0;
    do {
      bVar1 = pIdx->azColl[uVar3][lVar4];
      bVar2 = pPk->azColl[iCol][lVar4];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_0018c977;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_0018c977;
      lVar4 = lVar4 + 1;
    } while( true );
  }
  goto LAB_0018c97c;
LAB_0018c977:
  if (bVar1 == bVar2) {
    return 1;
  }
LAB_0018c97c:
  uVar3 = uVar3 + 1;
  if (uVar3 == (uint)nKey) {
    return 0;
  }
  goto LAB_0018c938;
}

Assistant:

static int isDupColumn(Index *pIdx, int nKey, Index *pPk, int iCol){
  int i, j;
  assert( nKey<=pIdx->nColumn );
  assert( iCol<MAX(pPk->nColumn,pPk->nKeyCol) );
  assert( pPk->idxType==SQLITE_IDXTYPE_PRIMARYKEY );
  assert( pPk->pTable->tabFlags & TF_WithoutRowid );
  assert( pPk->pTable==pIdx->pTable );
  testcase( pPk==pIdx );
  j = pPk->aiColumn[iCol];
  assert( j!=XN_ROWID && j!=XN_EXPR );
  for(i=0; i<nKey; i++){
    assert( pIdx->aiColumn[i]>=0 || j>=0 );
    if( pIdx->aiColumn[i]==j
     && sqlite3StrICmp(pIdx->azColl[i], pPk->azColl[iCol])==0
    ){
      return 1;
    }
  }
  return 0;
}